

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir_array_refcount.cpp
# Opt level: O2

void __thiscall
ir_array_refcount_entry::ir_array_refcount_entry(ir_array_refcount_entry *this,ir_variable *var)

{
  glsl_type *pgVar1;
  uint uVar2;
  uint uVar3;
  uint *__s;
  anon_union_8_3_d6fb00c4_for_fields *paVar4;
  uint uVar5;
  ulong __n;
  
  this->var = var;
  this->is_referenced = false;
  paVar4 = (anon_union_8_3_d6fb00c4_for_fields *)&var->type;
  uVar2 = glsl_type::arrays_of_arrays_size(var->type);
  uVar5 = 1;
  uVar3 = 1;
  if (uVar2 != 0) {
    uVar3 = glsl_type::arrays_of_arrays_size(paVar4->array);
  }
  this->num_bits = uVar3;
  __n = (ulong)((uint)((ulong)uVar3 + 0x1f >> 3) & 0xfffffffc);
  __s = (uint *)operator_new__(__n);
  this->bits = __s;
  memset(__s,0,__n);
  this->array_depth = 0;
  while (pgVar1 = paVar4->array, pgVar1->field_0x4 == '\x11') {
    this->array_depth = uVar5;
    uVar5 = uVar5 + 1;
    paVar4 = &pgVar1->fields;
  }
  return;
}

Assistant:

ir_array_refcount_entry::ir_array_refcount_entry(ir_variable *var)
   : var(var), is_referenced(false)
{
   num_bits = MAX2(1, var->type->arrays_of_arrays_size());
   bits = new BITSET_WORD[BITSET_WORDS(num_bits)];
   memset(bits, 0, BITSET_WORDS(num_bits) * sizeof(bits[0]));

   /* Count the "depth" of the arrays-of-arrays. */
   array_depth = 0;
   for (const glsl_type *type = var->type;
        type->is_array();
        type = type->fields.array) {
      array_depth++;
   }
}